

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_ratio(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL ratio;
  REF_INT node3;
  REF_INT node2;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  _node3 = ref_grid->node;
  *allowed = 0;
  ref_node = (REF_NODE)allowed;
  allowed_local._0_4_ = node1;
  allowed_local._4_4_ = node0;
  _node1_local = ref_grid;
  uVar1 = ref_swap_node23(ref_grid,node0,node1,(REF_INT *)((long)&ratio + 4),(REF_INT *)&ratio);
  if (uVar1 == 0) {
    ref_grid_local._4_4_ =
         ref_node_ratio(_node3,ratio._4_4_,ratio._0_4_,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (ref_grid_local._4_4_ == 0) {
      if ((_ref_private_macro_code_rss_1 <= _node1_local->adapt->post_min_ratio) ||
         (_node1_local->adapt->post_max_ratio <= _ref_private_macro_code_rss_1)) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        ref_node->n = 1;
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x276,
             "ref_swap_ratio",(ulong)ref_grid_local._4_4_,"ratio");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x275,
           "ref_swap_ratio",(ulong)uVar1,"other nodes");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_ratio(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node2, node3;
  REF_DBL ratio;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");
  RSS(ref_node_ratio(ref_node, node2, node3, &ratio), "ratio");

  if (ref_grid_adapt(ref_grid, post_min_ratio) < ratio &&
      ratio < ref_grid_adapt(ref_grid, post_max_ratio)) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}